

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  CppType CVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  Type *pTVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x325);
    pLVar3 = LogMessage::operator<<(&local_50,"CHECK failed: extension != nullptr: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  if (pEVar2->is_repeated == false) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x326);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                       );
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  CVar1 = anon_unknown_26::cpp_type(pEVar2->type);
  if (CVar1 != CPPTYPE_MESSAGE) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x326);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                       );
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  pTVar4 = RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(pEVar2->field_0).string_value,index);
  return pTVar4;
}

Assistant:

const MessageLite& ExtensionSet::GetRepeatedMessage(int number,
                                                    int index) const {
  const Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  return extension->repeated_message_value->Get(index);
}